

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.c
# Opt level: O0

void traverse(int i)

{
  int i_00;
  int iVar1;
  uint *puVar2;
  long lVar3;
  int *piVar4;
  uint *base;
  int *piStack_38;
  int height;
  Yshort *rp;
  int j;
  uint *fp3;
  uint *fp2;
  uint *fp1;
  int i_local;
  
  top = top + 1;
  VERTICES[top] = i;
  iVar1 = top;
  INDEX[i] = top;
  puVar2 = F + i * tokensetsize;
  lVar3 = (long)tokensetsize;
  piStack_38 = R[i];
  if (R[i] != (int *)0x0) {
    while( true ) {
      piVar4 = piStack_38 + 1;
      i_00 = *piStack_38;
      if (i_00 < 0) break;
      if (INDEX[i_00] == 0) {
        traverse(i_00);
      }
      if (INDEX[i_00] < INDEX[i]) {
        INDEX[i] = INDEX[i_00];
      }
      fp3 = F + i_00 * tokensetsize;
      fp2 = puVar2;
      while (piStack_38 = piVar4, fp2 < puVar2 + lVar3) {
        *fp2 = *fp3 | *fp2;
        fp3 = fp3 + 1;
        fp2 = fp2 + 1;
      }
    }
  }
  if (INDEX[i] == iVar1) {
    while( true ) {
      iVar1 = VERTICES[top];
      top = top + -1;
      INDEX[iVar1] = infinity;
      if (i == iVar1) break;
      fp3 = F + iVar1 * tokensetsize;
      fp2 = puVar2;
      while (fp2 < puVar2 + lVar3) {
        *fp3 = *fp2;
        fp3 = fp3 + 1;
        fp2 = fp2 + 1;
      }
    }
  }
  return;
}

Assistant:

void traverse(int i)
{
  register unsigned *fp1;
  register unsigned *fp2;
  register unsigned *fp3;
  register int j;
  register Yshort *rp;

  int height;
  unsigned *base;

  VERTICES[++top] = i;
  INDEX[i] = height = top;

  base = F + i * tokensetsize;
  fp3 = base + tokensetsize;

  rp = R[i];
  if (rp)
    {
      while ((j = *rp++) >= 0)
	{
	  if (INDEX[j] == 0)
	    traverse(j);

	  if (INDEX[i] > INDEX[j])
	    INDEX[i] = INDEX[j];

	  fp1 = base;
	  fp2 = F + j * tokensetsize;

	  while (fp1 < fp3)
	    *fp1++ |= *fp2++;
	}
    }

  if (INDEX[i] == height)
    {
      for (;;)
	{
	  j = VERTICES[top--];
	  INDEX[j] = infinity;

	  if (i == j)
	    break;

	  fp1 = base;
	  fp2 = F + j * tokensetsize;

	  while (fp1 < fp3)
	    *fp2++ = *fp1++;
	}
    }
}